

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O2

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::Iterator::updateTriplet(Iterator *this)

{
  int iVar1;
  int iVar2;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *pSVar3;
  ulong uVar4;
  pointer piVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  
  pdVar6 = VectorDynSize::operator()(&this->m_matrix->m_values,(long)this->m_index);
  (this->m_currentTriplet).m_value = pdVar6;
  pSVar3 = this->m_matrix;
  (this->m_currentTriplet).m_row =
       (pSVar3->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[this->m_index];
  iVar1 = this->m_nonZerosInOuterDirection;
  this->m_nonZerosInOuterDirection = iVar1 + -1;
  if (iVar1 < 2) {
    uVar4 = pSVar3->m_columns;
    uVar8 = (long)(this->m_currentTriplet).m_column;
    do {
      uVar7 = uVar8 + 1;
      (this->m_currentTriplet).m_column = (int)uVar7;
      if (uVar4 <= uVar7) {
        return;
      }
      piVar5 = (pSVar3->m_outerStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar5[uVar8 + 2];
      iVar2 = piVar5[uVar7];
      iVar9 = iVar1 - iVar2;
      this->m_nonZerosInOuterDirection = iVar9;
      uVar8 = uVar7;
    } while (iVar9 == 0 || iVar1 < iVar2);
  }
  return;
}

Assistant:

void SparseMatrix<iDynTree::ColumnMajor>::Iterator::updateTriplet()
    {
        m_currentTriplet.m_value = &(m_matrix.m_values(m_index));
        m_currentTriplet.m_row = m_matrix.m_innerIndices[m_index];

        if (--m_nonZerosInOuterDirection <= 0) {
            m_currentTriplet.m_column++;
            while (static_cast<std::size_t>(m_currentTriplet.m_column) < m_matrix.columns()) {
                //compute row NNZ
                m_nonZerosInOuterDirection = m_matrix.m_outerStarts[m_currentTriplet.m_column + 1]
                - m_matrix.m_outerStarts[m_currentTriplet.m_column];
                if (m_nonZerosInOuterDirection > 0)
                    break;

                //increment row
                m_currentTriplet.m_column++;
            }
        }
    }